

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertersC.cpp
# Opt level: O3

char ** SoapySDRConverter_listTargetFormats(char *sourceFormat,size_t *length)

{
  char **ppcVar1;
  size_t minLength;
  allocator local_49;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  string local_30;
  
  *length = 0;
  SoapySDRDevice_clearError();
  std::__cxx11::string::string((string *)&local_30,sourceFormat,&local_49);
  SoapySDR::ConverterRegistry::listTargetFormats(&local_48,&local_30);
  ppcVar1 = toStrArray(&local_48,length,minLength);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return ppcVar1;
}

Assistant:

char **SoapySDRConverter_listTargetFormats(const char *sourceFormat, size_t *length)
{
    *length = 0;

    __SOAPY_SDR_C_TRY
    return toStrArray(SoapySDR::ConverterRegistry::listTargetFormats(sourceFormat), length);
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}